

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIStaticText.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUIStaticText::CGUIStaticText
          (CGUIStaticText *this,wchar_t *text,bool border,IGUIEnvironment *environment,
          IGUIElement *parent,s32 id,rect<int> *rectangle,bool background)

{
  rect<int> rectangle_00;
  wchar_t wVar1;
  long lVar2;
  undefined8 *puVar3;
  long *in_RCX;
  byte in_DL;
  byte bVar4;
  wchar_t *in_RDI;
  undefined4 in_R9D;
  undefined8 *in_stack_00000008;
  undefined1 in_stack_00000010;
  array<irr::core::string<wchar_t>_> *this_00;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined3 in_stack_ffffffffffffffd0;
  uint uVar5;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar4 = in_DL & 1;
  uVar5 = CONCAT13(in_stack_00000010,in_stack_ffffffffffffffd0) & 0x1ffffff;
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)(in_RDI + 0x60));
  this_00 = (array<irr::core::string<wchar_t>_> *)in_stack_00000008[1];
  rectangle_00.LowerRightCorner._0_7_ = in_stack_ffffffffffffffe8;
  rectangle_00.UpperLeftCorner = (vector2d<int>)in_RCX;
  rectangle_00.LowerRightCorner.Y._3_1_ = bVar4;
  IGUIStaticText::IGUIStaticText
            ((IGUIStaticText *)CONCAT44(in_R9D,uVar5),(void **)this_00,
             (IGUIEnvironment *)*in_stack_00000008,
             (IGUIElement *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (s32)((ulong)in_RDI >> 0x20),rectangle_00);
  in_RDI[0] = L'\x00448168';
  in_RDI[1] = L'\0';
  in_RDI[0x60] = L'\x00448358';
  in_RDI[0x61] = L'\0';
  in_RDI[0x4d] = L'\0';
  in_RDI[0x4e] = L'\0';
  *(byte *)(in_RDI + 0x4f) = bVar4 & 1;
  *(undefined1 *)((long)in_RDI + 0x13d) = 0;
  *(undefined1 *)((long)in_RDI + 0x13e) = 0;
  *(undefined1 *)((long)in_RDI + 0x13f) = 0;
  *(byte *)(in_RDI + 0x50) = (byte)(uVar5 >> 0x18) & 1;
  *(undefined1 *)((long)in_RDI + 0x141) = 1;
  *(undefined1 *)((long)in_RDI + 0x142) = 0;
  video::SColor::SColor((SColor *)(in_RDI + 0x51),0x65,0xff,0xff,0xff);
  video::SColor::SColor((SColor *)(in_RDI + 0x52),0x65,0xd2,0xd2,0xd2);
  in_RDI[0x54] = L'\0';
  in_RDI[0x55] = L'\0';
  in_RDI[0x56] = L'\0';
  in_RDI[0x57] = L'\0';
  core::array<irr::core::string<wchar_t>_>::array(this_00);
  core::string<wchar_t>::operator=
            ((string<wchar_t> *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_RDI
            );
  if (in_RCX != (long *)0x0) {
    lVar2 = (**(code **)(*in_RCX + 0x60))();
    if (lVar2 != 0) {
      puVar3 = (undefined8 *)(**(code **)(*in_RCX + 0x60))();
      wVar1 = (**(code **)*puVar3)(puVar3,2);
      in_RDI[0x52] = wVar1;
    }
  }
  return;
}

Assistant:

CGUIStaticText::CGUIStaticText(const wchar_t *text, bool border,
		IGUIEnvironment *environment, IGUIElement *parent,
		s32 id, const core::rect<s32> &rectangle,
		bool background) :
		IGUIStaticText(environment, parent, id, rectangle),
		HAlign(EGUIA_UPPERLEFT), VAlign(EGUIA_UPPERLEFT),
		Border(border), OverrideColorEnabled(false), OverrideBGColorEnabled(false), WordWrap(false), Background(background),
		RestrainTextInside(true), RightToLeft(false),
		OverrideColor(video::SColor(101, 255, 255, 255)), BGColor(video::SColor(101, 210, 210, 210)),
		OverrideFont(0), LastBreakFont(0)
{
#ifdef _DEBUG
	setDebugName("CGUIStaticText");
#endif

	Text = text;
	if (environment && environment->getSkin()) {
		BGColor = environment->getSkin()->getColor(gui::EGDC_3D_FACE);
	}
}